

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  uint uStack_10908;
  uint uStack_10904;
  uint uStack_10900;
  uint uStack_108fc;
  EXRImage EStack_108f8;
  EXRVersion EStack_108d4;
  EXRHeader EStack_108c0;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
      return -3;
    }
    return -3;
  }
  memset(&EStack_108c0,0,0x10890);
  iVar7 = ParseEXRVersionFromMemory(&EStack_108d4,memory);
  if (iVar7 != 0) {
    return iVar7;
  }
  iVar7 = ParseEXRHeaderFromMemory(&EStack_108c0,&EStack_108d4,memory,err);
  if (iVar7 != 0) {
    return iVar7;
  }
  EStack_108f8.width = 0;
  EStack_108f8.height = 0;
  EStack_108f8.num_channels = 0;
  EStack_108f8.tiles = (EXRTile *)0x0;
  EStack_108f8.images._0_4_ = 0;
  EStack_108f8.images._4_4_ = 0;
  iVar7 = LoadEXRImageFromMemory(&EStack_108f8,&EStack_108c0,memory,err);
  if (iVar7 == 0) {
    if ((long)EStack_108c0.num_channels < 1) {
      uStack_108fc = 0xffffffff;
      uStack_10900 = 0xffffffff;
      uStack_10904 = 0xffffffff;
      uStack_10908 = 0xffffffff;
    }
    else {
      uStack_10908 = 0xffffffff;
      lVar10 = 0;
      uStack_10904 = 0xffffffff;
      uStack_10900 = 0xffffffff;
      uStack_108fc = 0xffffffff;
      do {
        iVar7 = strcmp((EStack_108c0.channels)->name,"R");
        uVar9 = (uint)lVar10;
        uVar4 = uStack_10904;
        uVar5 = uStack_10900;
        uVar6 = uVar9;
        if ((((iVar7 != 0) &&
             (iVar7 = strcmp((EStack_108c0.channels)->name,"G"), uVar5 = uVar9, uVar6 = uStack_108fc
             , iVar7 != 0)) &&
            (iVar7 = strcmp((EStack_108c0.channels)->name,"B"), uVar4 = uVar9, uVar5 = uStack_10900,
            iVar7 != 0)) &&
           (iVar7 = strcmp((EStack_108c0.channels)->name,"A"), uVar4 = uStack_10904, iVar7 == 0)) {
          uStack_10908 = uVar9;
        }
        uStack_108fc = uVar6;
        uStack_10900 = uVar5;
        uStack_10904 = uVar4;
        lVar10 = lVar10 + 1;
        EStack_108c0.channels = EStack_108c0.channels + 1;
      } while (EStack_108c0.num_channels != lVar10);
    }
    if (uStack_108fc == 0xffffffff) {
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar8 = "R channel not found\n";
    }
    else if (uStack_10900 == 0xffffffff) {
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar8 = "G channel not found\n";
    }
    else {
      if (uStack_10904 != 0xffffffff) {
        if (EStack_108f8.height * EStack_108f8.width < 1) {
          return 0;
        }
        lVar3 = CONCAT44(EStack_108f8.images._4_4_,EStack_108f8.images._0_4_);
        lVar10 = *(long *)(lVar3 + (long)(int)uStack_108fc * 8);
        lVar1 = *(long *)(lVar3 + (long)(int)uStack_10900 * 8);
        lVar2 = *(long *)(lVar3 + (long)(int)uStack_10904 * 8);
        lVar11 = 0;
        do {
          out_rgba[lVar11] = *(float *)(lVar10 + lVar11);
          out_rgba[lVar11 + 1] = *(float *)(lVar1 + lVar11);
          out_rgba[lVar11 + 2] = *(float *)(lVar2 + lVar11);
          fVar12 = 1.0;
          if (0 < (int)uStack_10908) {
            fVar12 = *(float *)(*(long *)(lVar3 + (ulong)uStack_10908 * 8) + lVar11);
          }
          out_rgba[lVar11 + 3] = fVar12;
          lVar11 = lVar11 + 4;
        } while ((ulong)(uint)(EStack_108f8.height * EStack_108f8.width) << 2 != lVar11);
        return 0;
      }
      if (err == (char **)0x0) {
        return -4;
      }
      pcVar8 = "B channel not found\n";
    }
    *err = pcVar8;
    return -4;
  }
  return iVar7;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exr_image.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exr_image.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return TINYEXR_SUCCESS;
}